

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcCexTools.c
# Opt level: O0

Gia_Man_t * Bmc_CexBuildNetwork(Gia_Man_t *p,Abc_Cex_t *pCex)

{
  undefined8 uVar1;
  ulong uVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  Gia_Man_t *p_00;
  char *pcVar6;
  Gia_Obj_t *pGVar7;
  Gia_Man_t *pGVar8;
  bool bVar9;
  int local_54;
  int local_50;
  int iBit;
  int k;
  int i;
  int fCompl1;
  int fCompl0;
  Gia_Obj_t *pObjRi;
  Gia_Obj_t *pObjRo;
  Gia_Obj_t *pObj;
  Gia_Man_t *pTemp;
  Gia_Man_t *pNew;
  Abc_Cex_t *pCex_local;
  Gia_Man_t *p_local;
  
  local_54 = pCex->nRegs;
  p_00 = Gia_ManStart(1000);
  pcVar6 = Abc_UtilStrsav("unate");
  p_00->pName = pcVar6;
  pGVar7 = Gia_ManConst0(p);
  *(ulong *)pGVar7 = *(ulong *)pGVar7 & 0xffffffffbfffffff;
  pGVar7 = Gia_ManConst0(p);
  *(ulong *)pGVar7 = *(ulong *)pGVar7 & 0xbfffffffffffffff | 0x4000000000000000;
  pGVar7 = Gia_ManConst0(p);
  pGVar7->Value = 0xffffffff;
  local_50 = 0;
  while( true ) {
    iVar3 = Gia_ManRegNum(p);
    bVar9 = false;
    if (local_50 < iVar3) {
      iVar3 = Gia_ManPoNum(p);
      pObjRo = Gia_ManCo(p,iVar3 + local_50);
      bVar9 = pObjRo != (Gia_Obj_t *)0x0;
    }
    if (!bVar9) break;
    *(ulong *)pObjRo = *(ulong *)pObjRo & 0xffffffffbfffffff;
    *(ulong *)pObjRo = *(ulong *)pObjRo & 0xbfffffffffffffff | 0x4000000000000000;
    pObjRo->Value = 0xffffffff;
    local_50 = local_50 + 1;
  }
  Gia_ManHashAlloc(p_00);
  for (iBit = 0; iBit <= pCex->iFrame; iBit = iBit + 1) {
    local_50 = 0;
    while( true ) {
      iVar3 = Gia_ManPiNum(p);
      bVar9 = false;
      if (local_50 < iVar3) {
        pObjRo = Gia_ManCi(p,local_50);
        bVar9 = pObjRo != (Gia_Obj_t *)0x0;
      }
      if (!bVar9) break;
      uVar5 = Abc_InfoHasBit((uint *)(pCex + 1),local_54);
      *(ulong *)pObjRo = *(ulong *)pObjRo & 0xffffffffbfffffff | ((ulong)uVar5 & 1) << 0x1e;
      *(ulong *)pObjRo = *(ulong *)pObjRo & 0xbfffffffffffffff;
      uVar5 = Gia_ManAppendCi(p_00);
      pObjRo->Value = uVar5;
      local_50 = local_50 + 1;
      local_54 = local_54 + 1;
    }
    local_50 = 0;
    while( true ) {
      iVar3 = Gia_ManRegNum(p);
      bVar9 = false;
      if (local_50 < iVar3) {
        iVar3 = Gia_ManPoNum(p);
        _fCompl1 = Gia_ManCo(p,iVar3 + local_50);
        bVar9 = false;
        if (_fCompl1 != (Gia_Obj_t *)0x0) {
          iVar3 = Gia_ManPiNum(p);
          pObjRi = Gia_ManCi(p,iVar3 + local_50);
          bVar9 = pObjRi != (Gia_Obj_t *)0x0;
        }
      }
      if (!bVar9) break;
      *(ulong *)pObjRi =
           *(ulong *)pObjRi & 0xffffffffbfffffff |
           (ulong)((uint)(*(ulong *)_fCompl1 >> 0x1e) & 1) << 0x1e;
      *(ulong *)pObjRi =
           *(ulong *)pObjRi & 0xbfffffffffffffff |
           (ulong)((uint)(*(ulong *)_fCompl1 >> 0x3e) & 1) << 0x3e;
      pObjRi->Value = _fCompl1->Value;
      local_50 = local_50 + 1;
    }
    local_50 = 0;
    while( true ) {
      bVar9 = false;
      if (local_50 < p->nObjs) {
        pObjRo = Gia_ManObj(p,local_50);
        bVar9 = pObjRo != (Gia_Obj_t *)0x0;
      }
      if (!bVar9) break;
      iVar3 = Gia_ObjIsAnd(pObjRo);
      if (iVar3 != 0) {
        pGVar7 = Gia_ObjFanin0(pObjRo);
        uVar2 = *(ulong *)pGVar7;
        uVar5 = Gia_ObjFaninC0(pObjRo);
        uVar5 = (uint)(uVar2 >> 0x1e) & 1 ^ uVar5;
        pGVar7 = Gia_ObjFanin1(pObjRo);
        uVar2 = *(ulong *)pGVar7;
        uVar4 = Gia_ObjFaninC1(pObjRo);
        uVar4 = (uint)(uVar2 >> 0x1e) & 1 ^ uVar4;
        *(ulong *)pObjRo =
             *(ulong *)pObjRo & 0xffffffffbfffffff | ((ulong)(uVar5 & uVar4) & 1) << 0x1e;
        if ((*(ulong *)pObjRo >> 0x1e & 1) == 0) {
          if ((uVar5 == 0) && (uVar4 == 0)) {
            pGVar7 = Gia_ObjFanin0(pObjRo);
            uVar1 = *(undefined8 *)pGVar7;
            pGVar7 = Gia_ObjFanin1(pObjRo);
            *(ulong *)pObjRo =
                 *(ulong *)pObjRo & 0xbfffffffffffffff |
                 (ulong)((uint)((ulong)uVar1 >> 0x3e) & 1 |
                        (uint)((ulong)*(undefined8 *)pGVar7 >> 0x3e) & 1) << 0x3e;
          }
          else if (uVar5 == 0) {
            pGVar7 = Gia_ObjFanin0(pObjRo);
            *(ulong *)pObjRo =
                 *(ulong *)pObjRo & 0xbfffffffffffffff |
                 (ulong)((uint)((ulong)*(undefined8 *)pGVar7 >> 0x3e) & 1) << 0x3e;
          }
          else {
            if (uVar4 != 0) {
              __assert_fail("0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcCexTools.c"
                            ,0xf6,"Gia_Man_t *Bmc_CexBuildNetwork(Gia_Man_t *, Abc_Cex_t *)");
            }
            pGVar7 = Gia_ObjFanin1(pObjRo);
            *(ulong *)pObjRo =
                 *(ulong *)pObjRo & 0xbfffffffffffffff |
                 (ulong)((uint)((ulong)*(undefined8 *)pGVar7 >> 0x3e) & 1) << 0x3e;
          }
        }
        else {
          pGVar7 = Gia_ObjFanin0(pObjRo);
          uVar1 = *(undefined8 *)pGVar7;
          pGVar7 = Gia_ObjFanin1(pObjRo);
          *(ulong *)pObjRo =
               *(ulong *)pObjRo & 0xbfffffffffffffff |
               (ulong)((uint)((ulong)uVar1 >> 0x3e) & 1 &
                      (uint)((ulong)*(undefined8 *)pGVar7 >> 0x3e) & 1) << 0x3e;
        }
        pObjRo->Value = 0xffffffff;
        if ((*(ulong *)pObjRo >> 0x3e & 1) == 0) {
          if ((*(ulong *)pObjRo >> 0x1e & 1) == 0) {
            if ((uVar5 == 0) && (uVar4 == 0)) {
              pGVar7 = Gia_ObjFanin0(pObjRo);
              uVar5 = pGVar7->Value;
              pGVar7 = Gia_ObjFanin1(pObjRo);
              uVar5 = Gia_ManHashOr(p_00,uVar5,pGVar7->Value);
              pObjRo->Value = uVar5;
            }
            else if (uVar5 == 0) {
              pGVar7 = Gia_ObjFanin0(pObjRo);
              pObjRo->Value = pGVar7->Value;
            }
            else {
              if (uVar4 != 0) {
                __assert_fail("0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcCexTools.c"
                              ,0x102,"Gia_Man_t *Bmc_CexBuildNetwork(Gia_Man_t *, Abc_Cex_t *)");
              }
              pGVar7 = Gia_ObjFanin1(pObjRo);
              pObjRo->Value = pGVar7->Value;
            }
          }
          else {
            pGVar7 = Gia_ObjFanin0(pObjRo);
            uVar5 = pGVar7->Value;
            pGVar7 = Gia_ObjFanin1(pObjRo);
            uVar5 = Gia_ManHashAnd(p_00,uVar5,pGVar7->Value);
            pObjRo->Value = uVar5;
          }
          if (pObjRo->Value == 0) {
            __assert_fail("pObj->Value > 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcCexTools.c"
                          ,0x103,"Gia_Man_t *Bmc_CexBuildNetwork(Gia_Man_t *, Abc_Cex_t *)");
          }
        }
      }
      local_50 = local_50 + 1;
    }
    local_50 = 0;
    while( true ) {
      iVar3 = Vec_IntSize(p->vCos);
      bVar9 = false;
      if (local_50 < iVar3) {
        pObjRo = Gia_ManCo(p,local_50);
        bVar9 = pObjRo != (Gia_Obj_t *)0x0;
      }
      if (!bVar9) break;
      pGVar7 = Gia_ObjFanin0(pObjRo);
      uVar2 = *(ulong *)pGVar7;
      uVar5 = Gia_ObjFaninC0(pObjRo);
      *(ulong *)pObjRo =
           *(ulong *)pObjRo & 0xffffffffbfffffff |
           ((ulong)((uint)(uVar2 >> 0x1e) & 1 ^ uVar5) & 1) << 0x1e;
      pGVar7 = Gia_ObjFanin0(pObjRo);
      *(ulong *)pObjRo =
           *(ulong *)pObjRo & 0xbfffffffffffffff |
           (ulong)((uint)((ulong)*(undefined8 *)pGVar7 >> 0x3e) & 1) << 0x3e;
      pGVar7 = Gia_ObjFanin0(pObjRo);
      pObjRo->Value = pGVar7->Value;
      local_50 = local_50 + 1;
    }
  }
  Gia_ManHashStop(p_00);
  if (local_54 != pCex->nBits) {
    __assert_fail("iBit == pCex->nBits",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcCexTools.c"
                  ,0x10e,"Gia_Man_t *Bmc_CexBuildNetwork(Gia_Man_t *, Abc_Cex_t *)");
  }
  pGVar7 = Gia_ManPo(p,pCex->iPo);
  if (((uint)(*(ulong *)pGVar7 >> 0x1e) & 1) != 1) {
    __assert_fail("pObj->fMark0 == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcCexTools.c"
                  ,0x111,"Gia_Man_t *Bmc_CexBuildNetwork(Gia_Man_t *, Abc_Cex_t *)");
  }
  if ((*(ulong *)pGVar7 >> 0x3e & 1) != 0) {
    __assert_fail("pObj->fMark1 == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcCexTools.c"
                  ,0x112,"Gia_Man_t *Bmc_CexBuildNetwork(Gia_Man_t *, Abc_Cex_t *)");
  }
  if (pGVar7->Value == 0) {
    __assert_fail("pObj->Value > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcCexTools.c"
                  ,0x113,"Gia_Man_t *Bmc_CexBuildNetwork(Gia_Man_t *, Abc_Cex_t *)");
  }
  Gia_ManAppendCo(p_00,pGVar7->Value);
  pGVar8 = Gia_ManCleanup(p_00);
  Gia_ManStop(p_00);
  return pGVar8;
}

Assistant:

Gia_Man_t * Bmc_CexBuildNetwork( Gia_Man_t * p, Abc_Cex_t * pCex )
{
    Gia_Man_t * pNew, * pTemp;
    Gia_Obj_t * pObj, * pObjRo, * pObjRi;
    int fCompl0, fCompl1;
    int i, k, iBit = pCex->nRegs;
    // start the manager
    pNew = Gia_ManStart( 1000 );
    pNew->pName = Abc_UtilStrsav( "unate" );
    // set const0
    Gia_ManConst0(p)->fMark0 = 0;
    Gia_ManConst0(p)->fMark1 = 1;
    Gia_ManConst0(p)->Value  = ~0;
    // set init state
    Gia_ManForEachRi( p, pObj, k )
    {
        pObj->fMark0 = 0;
        pObj->fMark1 = 1;
        pObj->Value  = ~0;
    }
    Gia_ManHashAlloc( pNew );
    for ( i = 0; i <= pCex->iFrame; i++ )
    {
        //  primary inputs
        Gia_ManForEachPi( p, pObj, k )
        {
            pObj->fMark0 = Abc_InfoHasBit( pCex->pData, iBit++ );
            pObj->fMark1 = 0;
            pObj->Value  = Gia_ManAppendCi(pNew);
        }
        // transfer 
        Gia_ManForEachRiRo( p, pObjRi, pObjRo, k )
        {
            pObjRo->fMark0 = pObjRi->fMark0;
            pObjRo->fMark1 = pObjRi->fMark1;
            pObjRo->Value  = pObjRi->Value;
        }
        // internal nodes
        Gia_ManForEachAnd( p, pObj, k )
        {
            fCompl0 = Gia_ObjFanin0(pObj)->fMark0 ^ Gia_ObjFaninC0(pObj);
            fCompl1 = Gia_ObjFanin1(pObj)->fMark0 ^ Gia_ObjFaninC1(pObj);
            pObj->fMark0 = fCompl0 & fCompl1;
            if ( pObj->fMark0 )
                pObj->fMark1 = Gia_ObjFanin0(pObj)->fMark1 & Gia_ObjFanin1(pObj)->fMark1;
            else if ( !fCompl0 && !fCompl1 )
                pObj->fMark1 = Gia_ObjFanin0(pObj)->fMark1 | Gia_ObjFanin1(pObj)->fMark1;
            else if ( !fCompl0 )
                pObj->fMark1 = Gia_ObjFanin0(pObj)->fMark1;
            else if ( !fCompl1 )
                pObj->fMark1 = Gia_ObjFanin1(pObj)->fMark1;
            else assert( 0 );
            pObj->Value = ~0;
            if ( pObj->fMark1 )
                continue;
            if ( pObj->fMark0 )
                pObj->Value = Gia_ManHashAnd( pNew, Gia_ObjFanin0(pObj)->Value, Gia_ObjFanin1(pObj)->Value );
            else if ( !fCompl0 && !fCompl1 )
                pObj->Value = Gia_ManHashOr( pNew, Gia_ObjFanin0(pObj)->Value, Gia_ObjFanin1(pObj)->Value );
            else if ( !fCompl0 )
                pObj->Value = Gia_ObjFanin0(pObj)->Value;
            else if ( !fCompl1 )
                pObj->Value = Gia_ObjFanin1(pObj)->Value;
            else assert( 0 );
            assert( pObj->Value > 0 );
        }
        // combinational outputs
        Gia_ManForEachCo( p, pObj, k )
        {
            pObj->fMark0 = Gia_ObjFanin0(pObj)->fMark0 ^ Gia_ObjFaninC0(pObj);
            pObj->fMark1 = Gia_ObjFanin0(pObj)->fMark1;
            pObj->Value  = Gia_ObjFanin0(pObj)->Value;
        }
    }
    Gia_ManHashStop( pNew );
    assert( iBit == pCex->nBits );
    // create primary output
    pObj = Gia_ManPo(p, pCex->iPo);
    assert( pObj->fMark0 == 1 );
    assert( pObj->fMark1 == 0 );
    assert( pObj->Value > 0 );
    Gia_ManAppendCo( pNew, pObj->Value );
    // cleanup
    pNew = Gia_ManCleanup( pTemp = pNew );
    Gia_ManStop( pTemp );
    return pNew;
}